

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O2

void __thiscall mir::inst::PtrOffsetInst::display(PtrOffsetInst *this,ostream *o)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  ostream *poVar1;
  undefined8 extraout_RDX;
  
  (**(this->super_Inst).dest.super_Displayable._vptr_Displayable)(&(this->super_Inst).dest);
  poVar1 = std::operator<<(o," = offset ");
  (**(this->ptr).super_Displayable._vptr_Displayable)(&this->ptr,poVar1);
  poVar1 = std::operator<<(poVar1," by ");
  UNRECOVERED_JUMPTABLE = *(this->offset).super_Displayable._vptr_Displayable;
  (*UNRECOVERED_JUMPTABLE)(&this->offset,poVar1,extraout_RDX,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void PtrOffsetInst::display(std::ostream& o) const {
  o << dest << " = offset " << ptr << " by " << offset;
}